

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O1

void __thiscall
duckdb_parquet::BloomFilterHeader::BloomFilterHeader(BloomFilterHeader *this,void **vtt)

{
  _BloomFilterAlgorithm__isset *p_Var1;
  _BloomFilterHash__isset *p_Var2;
  _BloomFilterCompression__isset *p_Var3;
  void *pvVar4;
  
  pvVar4 = *vtt;
  *(void **)this = pvVar4;
  *(void **)(&this->field_0x0 + *(long *)((long)pvVar4 + -0x30)) = vtt[1];
  this->numBytes = 0;
  *(undefined ***)&this->algorithm = &PTR__BloomFilterAlgorithm_024c8270;
  (this->algorithm).BLOCK = (SplitBlockAlgorithm)&PTR__SplitBlockAlgorithm_024c8208;
  p_Var1 = &(this->algorithm).__isset;
  *p_Var1 = (_BloomFilterAlgorithm__isset)((byte)*p_Var1 & 0xfe);
  *(undefined ***)&this->hash = &PTR__BloomFilterHash_024c8340;
  (this->hash).XXHASH = (XxHash)&PTR__XxHash_024c82d8;
  p_Var2 = &(this->hash).__isset;
  *p_Var2 = (_BloomFilterHash__isset)((byte)*p_Var2 & 0xfe);
  *(undefined ***)&this->compression = &PTR__BloomFilterCompression_024c8410;
  (this->compression).UNCOMPRESSED = (Uncompressed)&PTR__Uncompressed_024c83a8;
  p_Var3 = &(this->compression).__isset;
  *p_Var3 = (_BloomFilterCompression__isset)((byte)*p_Var3 & 0xfe);
  return;
}

Assistant:

BloomFilterHeader::BloomFilterHeader() noexcept
   : numBytes(0) {
}